

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void readtechniques(uint32 numtechniques,uint8 *base,uint8 **ptr,uint32 *len,
                   MOJOSHADER_effectTechnique **techniques,MOJOSHADER_effectObject *objects,
                   MOJOSHADER_malloc m,void *d)

{
  undefined4 *puVar1;
  uint uVar2;
  uint uVar3;
  MOJOSHADER_effectTechnique *pMVar4;
  char *pcVar5;
  MOJOSHADER_effectPass *pMVar6;
  MOJOSHADER_effectState *pMVar7;
  uint uVar8;
  uint32 uVar9;
  uint32 valoffset;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint32 uVar14;
  undefined4 uVar15;
  ulong uVar16;
  long lVar17;
  
  if (numtechniques != 0) {
    pMVar4 = (MOJOSHADER_effectTechnique *)(*m)(numtechniques * 0x28,d);
    *techniques = pMVar4;
    uVar16 = 0;
    memset(pMVar4,0,(ulong)(numtechniques * 0x28));
    do {
      pMVar4 = *techniques + uVar16;
      uVar2 = *len;
      if (uVar2 < 4) {
        uVar2 = 0;
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)*(uint *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar2 = uVar2 - 4;
      }
      *len = uVar2;
      uVar9 = 0;
      uVar3 = 0;
      uVar14 = 0;
      if (3 < uVar2) {
        uVar14 = *(uint32 *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar3 = uVar2 - 4;
      }
      *len = uVar3;
      uVar2 = 0;
      if (3 < uVar3) {
        uVar2 = *(uint *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar9 = uVar3 - 4;
      }
      *len = uVar9;
      uVar3 = *(uint *)(base + uVar11);
      if ((ulong)uVar3 == 0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = (char *)(*m)(uVar3,d);
        memcpy(pcVar5,base + uVar11 + 4,(ulong)uVar3);
      }
      pMVar4->name = pcVar5;
      pMVar4->annotation_count = uVar14;
      readannotations(uVar14,base,ptr,len,&pMVar4->annotations,objects,m,d);
      pMVar4->pass_count = uVar2;
      if (uVar2 != 0) {
        pMVar6 = (MOJOSHADER_effectPass *)(*m)(uVar2 * 0x28,d);
        pMVar4->passes = pMVar6;
        memset(pMVar6,0,(ulong)(uVar2 * 0x28));
        uVar11 = 0;
        do {
          pMVar6 = pMVar4->passes + uVar11;
          uVar3 = *len;
          uVar8 = 0;
          if (uVar3 < 4) {
            uVar3 = 0;
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)*(uint *)*ptr;
            *ptr = (uint8 *)((long)*ptr + 4);
            uVar3 = uVar3 - 4;
          }
          *len = uVar3;
          uVar14 = 0;
          if (3 < uVar3) {
            uVar14 = *(uint32 *)*ptr;
            *ptr = (uint8 *)((long)*ptr + 4);
            uVar8 = uVar3 - 4;
          }
          *len = uVar8;
          uVar9 = 0;
          uVar10 = 0;
          if (3 < uVar8) {
            uVar10 = (ulong)*(uint *)*ptr;
            *ptr = (uint8 *)((long)*ptr + 4);
            uVar9 = uVar8 - 4;
          }
          *len = uVar9;
          uVar3 = *(uint *)(base + uVar12);
          if ((ulong)uVar3 == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = (char *)(*m)(uVar3,d);
            memcpy(pcVar5,base + uVar12 + 4,(ulong)uVar3);
          }
          pMVar6->name = pcVar5;
          pMVar6->annotation_count = uVar14;
          readannotations(uVar14,base,ptr,len,&pMVar6->annotations,objects,m,d);
          uVar3 = (uint)uVar10;
          pMVar6->state_count = uVar3;
          if (uVar3 != 0) {
            pMVar7 = (MOJOSHADER_effectState *)(*m)(uVar3 * 0x48,d);
            pMVar6->states = pMVar7;
            memset(pMVar7,0,(ulong)(uVar3 * 0x48));
            lVar17 = 0;
            do {
              pMVar7 = pMVar6->states;
              uVar3 = *len;
              uVar8 = 0;
              uVar13 = 0;
              uVar15 = 0;
              if (3 < uVar3) {
                uVar15 = *(undefined4 *)*ptr;
                *ptr = *ptr + 4;
                uVar13 = uVar3 - 4;
              }
              *len = uVar13;
              if (3 < uVar13) {
                *ptr = *ptr + 4;
                uVar8 = uVar13 - 4;
              }
              *len = uVar8;
              uVar9 = 0;
              uVar3 = 0;
              uVar14 = 0;
              if (3 < uVar8) {
                uVar14 = *(uint32 *)*ptr;
                *ptr = (uint8 *)((long)*ptr + 4);
                uVar3 = uVar8 - 4;
              }
              *len = uVar3;
              valoffset = 0;
              if (3 < uVar3) {
                valoffset = *(uint32 *)*ptr;
                *ptr = (uint8 *)((long)*ptr + 4);
                uVar9 = uVar3 - 4;
              }
              *len = uVar9;
              puVar1 = (undefined4 *)((long)&pMVar7->type + lVar17);
              *puVar1 = uVar15;
              readvalue(base,uVar14,valoffset,(MOJOSHADER_effectValue *)(puVar1 + 2),objects,m,d);
              lVar17 = lVar17 + 0x48;
            } while (uVar10 * 0x48 != lVar17);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != numtechniques);
  }
  return;
}

Assistant:

static void readtechniques(const uint32 numtechniques,
                           const uint8 *base,
                           const uint8 **ptr,
                           uint32 *len,
                           MOJOSHADER_effectTechnique **techniques,
                           MOJOSHADER_effectObject *objects,
                           MOJOSHADER_malloc m,
                           void *d)
{
    int i;
    if (numtechniques == 0) return;

    const uint32 siz = sizeof (MOJOSHADER_effectTechnique) * numtechniques;
    *techniques = (MOJOSHADER_effectTechnique *) m(siz, d);
    memset(*techniques, '\0', siz);

    for (i = 0; i < numtechniques; i++)
    {
        MOJOSHADER_effectTechnique *technique = &(*techniques)[i];

        const uint32 nameoffset = readui32(ptr, len);
        const uint32 numannos = readui32(ptr, len);
        const uint32 numpasses = readui32(ptr, len);

        technique->name = readstring(base, nameoffset, m, d);

        technique->annotation_count = numannos;
        readannotations(numannos, base, ptr, len,
                        &technique->annotations, objects,
                        m, d);

        technique->pass_count = numpasses;
        readpasses(numpasses, base, ptr, len,
                   &technique->passes, objects,
                   m, d);
    } // for
}